

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O0

string * __thiscall avro::json::Entity::toString_abi_cxx11_(Entity *this)

{
  uint uVar1;
  EVP_PKEY_CTX *ctx;
  element_type *peVar2;
  string *in_RDI;
  auto_ptr<avro::InputStream> in2;
  size_t c;
  size_t n;
  uint8_t *p;
  auto_ptr<avro::InputStream> in;
  JsonGenerator g;
  auto_ptr<avro::OutputStream> out;
  string *result;
  JsonGenerator *in_stack_ffffffffffffff10;
  string *psVar3;
  auto_ptr<avro::InputStream> local_c8;
  byte local_b9;
  long local_b8;
  size_t local_b0;
  void *local_a8;
  auto_ptr<avro::InputStream> local_a0;
  OutputStream *in_stack_ffffffffffffff68;
  Entity *in_stack_ffffffffffffff78;
  JsonGenerator *in_stack_ffffffffffffff80;
  auto_ptr<avro::OutputStream> local_18 [3];
  
  psVar3 = in_RDI;
  memoryOutputStream((size_t)in_RDI);
  JsonGenerator::JsonGenerator(in_stack_ffffffffffffff10);
  ctx = (EVP_PKEY_CTX *)std::auto_ptr<avro::OutputStream>::operator*(local_18);
  JsonGenerator::init((JsonGenerator *)&stack0xffffffffffffff78,ctx);
  writeEntity(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  JsonGenerator::flush((JsonGenerator *)0x2b65b6);
  std::auto_ptr<avro::OutputStream>::operator*(local_18);
  memoryInputStream(in_stack_ffffffffffffff68);
  local_a8 = (void *)0x0;
  local_b0 = 0;
  local_b8 = 0;
  while( true ) {
    peVar2 = std::auto_ptr<avro::InputStream>::operator->(&local_a0);
    uVar1 = (*peVar2->_vptr_InputStream[2])(peVar2,&local_a8,&local_b0);
    if ((uVar1 & 1) == 0) break;
    local_b8 = local_b0 + local_b8;
  }
  local_b9 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::resize((ulong)in_RDI);
  local_b8 = 0;
  std::auto_ptr<avro::OutputStream>::operator*(local_18);
  memoryInputStream(in_stack_ffffffffffffff68);
  while( true ) {
    peVar2 = std::auto_ptr<avro::InputStream>::operator->(&local_c8);
    uVar1 = (*peVar2->_vptr_InputStream[2])(peVar2,&local_a8,&local_b0);
    if ((uVar1 & 1) == 0) break;
    in_stack_ffffffffffffff10 = (JsonGenerator *)std::__cxx11::string::operator[]((ulong)in_RDI);
    memcpy(in_stack_ffffffffffffff10,local_a8,local_b0);
    local_b8 = local_b0 + local_b8;
  }
  local_b9 = 1;
  std::auto_ptr<avro::InputStream>::~auto_ptr
            ((auto_ptr<avro::InputStream> *)in_stack_ffffffffffffff10);
  if ((local_b9 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  std::auto_ptr<avro::InputStream>::~auto_ptr
            ((auto_ptr<avro::InputStream> *)in_stack_ffffffffffffff10);
  JsonGenerator::~JsonGenerator((JsonGenerator *)0x2b6779);
  std::auto_ptr<avro::OutputStream>::~auto_ptr
            ((auto_ptr<avro::OutputStream> *)in_stack_ffffffffffffff10);
  return psVar3;
}

Assistant:

std::string Entity::toString() const
{
    std::auto_ptr<OutputStream> out = memoryOutputStream();
    JsonGenerator g;
    g.init(*out);
    writeEntity(g, *this);
    g.flush();
    std::auto_ptr<InputStream> in = memoryInputStream(*out);
    const uint8_t *p = 0;
    size_t n = 0;
    size_t c = 0;
    while (in->next(&p, &n)) {
        c += n;
    }
    std::string result;
    result.resize(c);
    c = 0;
    std::auto_ptr<InputStream> in2 = memoryInputStream(*out);
    while (in2->next(&p, &n)) {
        ::memcpy(&result[c], p, n);
        c += n;
    }
    return result;
}